

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_ls.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  N_Vector u;
  UserData paVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  void *cvode_mem;
  SUNContext sunctx;
  SUNLogger logger;
  sunrealtype t;
  void *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 local_60;
  sunrealtype local_58;
  undefined8 local_50;
  UserData local_48;
  long local_40;
  double local_38;
  
  local_78 = (void *)0x0;
  iVar2 = 0;
  if (1 < argc) {
    iVar2 = atoi(argv[1]);
  }
  bVar9 = true;
  if (2 < argc) {
    iVar3 = atoi(argv[2]);
    bVar9 = iVar3 == 0;
  }
  uVar4 = SUNContext_Create(0,&local_70);
  if ((int)uVar4 < 0) {
    pcVar8 = "SUNContext_Create";
  }
  else {
    uVar4 = SUNLogger_Create(0,0,&local_60);
    if ((int)uVar4 < 0) {
      pcVar8 = "SUNLogger_Create";
    }
    else if ((bVar9) ||
            (uVar4 = SUNLogger_SetInfoFilename(local_60,"cvKrylovDemo_ls-info.txt"), -1 < (int)uVar4
            )) {
      uVar4 = SUNContext_SetLogger(local_70,local_60);
      if ((int)uVar4 < 0) {
        pcVar8 = "SUNContext_SetLogger";
      }
      else {
        u = (N_Vector)N_VNew_Serial(200,local_70);
        if (u == (N_Vector)0x0) {
          main_cold_7();
          return 1;
        }
        paVar5 = AllocUserData();
        if (paVar5 == (UserData)0x0) {
          main_cold_6();
          return 1;
        }
        paVar5->u = u;
        paVar5->om = 7.272205216643056e-05;
        paVar5->dx = 2.2222222222222223;
        paVar5->dy = 2.2222222222222223;
        paVar5->hdco = 8.099999999999999e-07;
        paVar5->haco = 0.000225;
        paVar5->vdco = 2.025e-09;
        SetInitialProfiles(u,2.2222222222222223,2.2222222222222223);
        local_78 = (void *)CVodeCreate(2,local_70);
        if (local_78 == (void *)0x0) {
          main_cold_5();
          return 1;
        }
        uVar4 = CVodeSetUserData(local_78,paVar5);
        if ((int)uVar4 < 0) {
          pcVar8 = "CVodeSetUserData";
        }
        else {
          uVar4 = CVodeInit(0,local_78,f,u);
          if ((int)uVar4 < 0) {
            pcVar8 = "CVodeInit";
          }
          else {
            uVar4 = CVodeSStolerances(0x88e368f1,0x3f50624dd2f1a9fc,local_78);
            if ((int)uVar4 < 0) {
              pcVar8 = "CVodeSStolerances";
            }
            else {
              if (!bVar9) {
                uVar4 = CVodeSetMonitorFn(local_78,myMonitorFunction);
                if ((int)uVar4 < 0) {
                  pcVar8 = "CVodeSetMonitorFn";
                  goto LAB_00102cb2;
                }
                uVar4 = CVodeSetMonitorFrequency(local_78,0x32);
                if ((int)uVar4 < 0) {
                  pcVar8 = "CVodeSetMonitorFrequency";
                  goto LAB_00102cb2;
                }
              }
              uVar6 = SUNNonlinSol_Newton(u,local_70);
              uVar4 = CVodeSetNonlinearSolver(local_78,uVar6);
              if (-1 < (int)uVar4) {
                if (iVar2 == 2) {
                  uVar4 = 0xbff00000;
                }
                else {
                  uVar4 = 0;
                }
                local_68 = (ulong)uVar4 << 0x20;
                if (iVar2 == 1) {
                  local_68 = 0x402c48c6001f0ac0;
                }
                iVar2 = 0;
                lVar7 = 0;
                local_50 = uVar6;
                local_48 = paVar5;
                do {
                  paVar5 = local_48;
                  if (iVar2 != 0) {
                    local_48->u = u;
                    local_48->om = 7.272205216643056e-05;
                    local_48->dx = 2.2222222222222223;
                    local_48->dy = 2.2222222222222223;
                    local_48->hdco = 8.099999999999999e-07;
                    local_48->haco = 0.000225;
                    local_48->vdco = 2.025e-09;
                    SetInitialProfiles(u,2.2222222222222223,2.2222222222222223);
                    uVar4 = CVodeReInit(0,local_78,u);
                    if ((int)uVar4 < 0) {
                      pcVar8 = "CVodeReInit";
                      goto LAB_00102cb2;
                    }
                  }
                  SUNLinSolFree(lVar7);
                  paVar5->linsolver = iVar2;
                  switch(iVar2) {
                  case 0:
                    printf(" -------");
                    puts(" \n| SPGMR |");
                    puts(" -------");
                    lVar7 = SUNLinSol_SPGMR(u,1,0,local_70);
                    if (lVar7 == 0) {
                      main_cold_4();
                      return 1;
                    }
                    break;
                  case 1:
                    printf(" ---------");
                    puts(" \n| SPFGMR |");
                    puts(" ---------");
                    lVar7 = SUNLinSol_SPFGMR(u,1,0,local_70);
                    if (lVar7 == 0) {
                      main_cold_3();
                      return 1;
                    }
                    break;
                  case 2:
                    printf(" -------");
                    puts(" \n| SPBCGS |");
                    puts(" -------");
                    lVar7 = SUNLinSol_SPBCGS(u,1,0,local_70);
                    if (lVar7 == 0) {
                      main_cold_2();
                      return 1;
                    }
                    break;
                  case 3:
                    printf(" ---------");
                    puts(" \n| SPTFQMR |");
                    puts(" ---------");
                    lVar7 = SUNLinSol_SPTFQMR(u,1,0,local_70);
                    if (lVar7 == 0) {
                      main_cold_1();
                      return 1;
                    }
                    break;
                  default:
                    goto switchD_00102898_default;
                  }
                  uVar4 = CVodeSetLinearSolver(local_78,lVar7,0);
                  if ((int)uVar4 < 0) {
                    pcVar8 = "CVodeSetLinearSolver";
                    goto LAB_00102cb2;
                  }
switchD_00102898_default:
                  uVar4 = CVodeSetPreconditioner(local_78,Precond,PSolve);
                  if ((int)uVar4 < 0) {
                    pcVar8 = "CVodeSetPreconditioner";
                    goto LAB_00102cb2;
                  }
                  uVar4 = CVodeSetLSNormFactor((int)local_68,local_78);
                  if ((int)uVar4 < 0) {
                    pcVar8 = "CVodeSetLSNormFactor";
                    goto LAB_00102cb2;
                  }
                  local_40 = lVar7;
                  puts(" \n2-species diurnal advection-diffusion problem\n");
                  iVar3 = 0xc;
                  dVar1 = 7200.0;
                  do {
                    local_38 = dVar1;
                    uVar4 = CVode(local_78,u,&local_58,1);
                    if (bVar9) {
                      PrintOutput(local_78,u,local_58);
                    }
                    if ((int)uVar4 < 0) {
                      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVode",
                              (ulong)uVar4);
                      break;
                    }
                    dVar1 = local_38 + 7200.0;
                    iVar3 = iVar3 + -1;
                  } while (iVar3 != 0);
                  if (!bVar9) {
                    PrintOutput(local_78,u,local_58);
                  }
                  PrintStats(local_78,iVar2,1);
                  lVar7 = local_40;
                  paVar5 = local_48;
                  iVar2 = iVar2 + 1;
                  if (iVar2 == 4) {
                    N_VDestroy(u);
                    FreeUserData(paVar5);
                    CVodeFree(&local_78);
                    SUNLinSolFree(lVar7);
                    SUNNonlinSolFree(local_50);
                    SUNLogger_Destroy(&local_60);
                    SUNContext_Free(&local_70);
                    return 0;
                  }
                } while( true );
              }
              pcVar8 = "CVodeSetNonlinearSolver";
            }
          }
        }
      }
    }
    else {
      pcVar8 = "SUNLogger_SetInfoFilename";
    }
  }
LAB_00102cb2:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar8,(ulong)uVar4);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  SUNNonlinearSolver NLS;
  void* cvode_mem;
  int linsolver, iout, retval;
  int nrmfactor;      /* LS norm conversion factor flag */
  sunrealtype nrmfac; /* LS norm conversion factor      */
  int monitor;        /* LS resiudal monitoring flag    */
  SUNContext sunctx;
  SUNLogger logger;
  const char* info_fname = "cvKrylovDemo_ls-info.txt";

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;
  nrmfactor = 0;
  monitor   = 0;

  /* Retrieve the command-line options */
  if (argc > 1) { nrmfactor = atoi(argv[1]); }
  if (argc > 2) { monitor = atoi(argv[2]); }

  /* Create SUNDIALS context and a logger which will record
     nonlinear solver info (e.g., residual) amongst other things. */

  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  retval = SUNLogger_Create(SUN_COMM_NULL, 0, &logger);
  if (check_retval(&retval, "SUNLogger_Create", 1)) { return 1; }

  if (monitor)
  {
    retval = SUNLogger_SetInfoFilename(logger, info_fname);
    if (check_retval(&retval, "SUNLogger_SetInfoFilename", 1)) { return 1; }
  }

  retval = SUNContext_SetLogger(sunctx, logger);
  if (check_retval(&retval, "SUNContext_SetLogger", 1)) { return 1; }

  /* Allocate memory, and set problem data, initial values, tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data, u);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the initial time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Set a function that CVode will call every 50 successful time steps.
   * This will be used to monitor the solution and integrator statistics. */
  if (monitor)
  {
    retval = CVodeSetMonitorFn(cvode_mem, myMonitorFunction);
    if (check_retval(&retval, "CVodeSetMonitorFn", 1)) { return (1); }
    retval = CVodeSetMonitorFrequency(cvode_mem, 50);
    if (check_retval(&retval, "CVodeSetMonitorFrequency", 1)) { return (1); }
  }

  /* Create the SUNNonlinearSolver */
  NLS = SUNNonlinSol_Newton(u, sunctx);
  if (check_retval(&retval, "SUNNonlinSol_Newton", 0)) { return (1); }

  /* Call CVodeSetNonlinearSolver to attach the nonlinear solver to CVode */
  retval = CVodeSetNonlinearSolver(cvode_mem, NLS);
  if (check_retval(&retval, "CVodeSetNonlinearSolver", 1)) { return (1); }

  /* START: Loop through SPGMR, SPFGMR, SPBCG and SPTFQMR linear solver modules */
  for (linsolver = 0; linsolver < 4; ++linsolver)
  {
    if (linsolver != 0)
    {
      /* Re-initialize user data */
      InitUserData(data, u);
      SetInitialProfiles(u, data->dx, data->dy);

      /* Re-initialize CVode for the solution of the same problem, but
       using a different linear solver module */
      retval = CVodeReInit(cvode_mem, T0, u);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }
    }

    /* Free previous linear solver and attach a new linear solver module */
    SUNLinSolFree(LS);

    /* Set the linear solver type in user data */
    data->linsolver = linsolver;

    switch (linsolver)
    {
    /* (a) SPGMR */
    case (USE_SPGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPGMR |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (b) SPFGMR */
    case (USE_SPFGMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPFGMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPFGMR to specify the linear solver SPFGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPFGMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPFGMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (c) SPBCG */
    case (USE_SPBCG):

      /* Print header */
      printf(" -------");
      printf(" \n| SPBCGS |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPBCGS to specify the linear solver SPBCGS with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPBCGS(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPBCGS", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (d) SPTFQMR */
    case (USE_SPTFQMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPTFQMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPTFQMR to specify the linear solver SPTFQMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPTFQMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPTFQMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;
    }

    /* Set preconditioner setup and solve routines Precond and PSolve,
       and the pointer to the user-defined block data */
    retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
    if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

    /* Set the linear solver tolerance conversion factor */
    switch (nrmfactor)
    {
    case (1):
      /* use the square root of the vector length */
      nrmfac = SQRT((sunrealtype)NEQ);
      break;
    case (2):
      /* compute with dot product */
      nrmfac = -ONE;
      break;
    default:
      /* use the default */
      nrmfac = ZERO;
      break;
    }

    retval = CVodeSetLSNormFactor(cvode_mem, nrmfac);
    if (check_retval(&retval, "CVodeSetLSNormFactor", 1)) { return (1); }

    /* In loop over output points, call CVode, print results, and test for error */
    printf(" \n2-species diurnal advection-diffusion problem\n\n");
    for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
    {
      retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
      if (!monitor) { PrintOutput(cvode_mem, u, t); }
      if (check_retval(&retval, "CVode", 1)) { break; }
    }
    if (monitor) { PrintOutput(cvode_mem, u, t); }
    PrintStats(cvode_mem, linsolver, 1);

  } /* END: Loop through SPGMR, SPBCG and SPTFQMR linear solver modules */

  /* Free memory */
  N_VDestroy(u);
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNNonlinSolFree(NLS);
  SUNLogger_Destroy(&logger);
  SUNContext_Free(&sunctx);

  return (0);
}